

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

uint __thiscall
RigidBodyDynamics::ConstraintSet::AddCustomConstraint
          (ConstraintSet *this,shared_ptr<RigidBodyDynamics::Constraint> *customConstraint)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  char *__s;
  iterator __position;
  long lVar4;
  size_type sVar5;
  uint uVar6;
  RBDLError *pRVar7;
  int iVar8;
  Index new_rows;
  ulong uVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  pVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar11;
  string nameStr;
  stringstream errormsg;
  allocator_type local_285;
  uint local_284;
  shared_ptr<RigidBodyDynamics::Constraint> *local_280;
  value_type local_278;
  ConstraintSet *local_258;
  DenseStorage<double,__1,__1,_1,_0> *local_250;
  DenseStorage<double,__1,__1,_1,_0> *local_248;
  DenseStorage<double,__1,__1,_1,_0> *local_240;
  ulong local_238;
  string local_230;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  uint local_1b0;
  value_type local_48;
  
  lVar2 = *(long *)(this + 0xd0);
  uVar9 = (ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 2;
  iVar8 = (int)uVar9;
  local_284 = ((customConstraint->
               super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->sizeOfConstraint + iVar8;
  lVar3 = *(long *)(this + 200);
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
  ::emplace_back<std::shared_ptr<RigidBodyDynamics::Constraint>&>
            ((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
              *)(this + 200),customConstraint);
  *(int *)(*(long *)(*(long *)(this + 200) + (lVar2 - lVar3 & 0xffffffff0U)) + 0x34) = iVar8;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_238 = uVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278);
  sVar5 = local_278._M_string_length;
  __s = (((customConstraint->
          super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        name)._M_dataplus._M_p;
  local_280 = customConstraint;
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_278,0,(char *)sVar5,(ulong)__s);
  }
  local_240 = (DenseStorage<double,__1,__1,_1,_0> *)(this + 0x110);
  uVar9 = (ulong)local_284;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize(local_240,uVar9,uVar9,1);
  local_248 = (DenseStorage<double,__1,__1,_1,_0> *)(this + 0x120);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize(local_248,uVar9,uVar9,1);
  local_250 = (DenseStorage<double,__1,__1,_1,_0> *)(this + 0x130);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize(local_250,uVar9,uVar9,1);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x140),uVar9,uVar9,1);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x150),uVar9,uVar9,1);
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)local_1d0,uVar9,&local_48,&local_285);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_move_assign
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(this + 0x600),local_1d0);
  if ((pair<unsigned_int,_unsigned_int>)local_1d0._0_8_ != (pair<unsigned_int,_unsigned_int>)0x0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity - local_1d0._0_8_);
  }
  if (((local_280->super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->sizeOfConstraint != 0) {
    local_258 = this + 8;
    uVar9 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(this + 0x20),&local_278);
      local_1d0._0_4_ = 2;
      __position._M_current = *(ConstraintType **)(this + 0x10);
      if (__position._M_current == *(ConstraintType **)(this + 0x18)) {
        std::
        vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
        ::_M_realloc_insert<RigidBodyDynamics::ConstraintType>
                  ((vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
                    *)local_258,__position,(ConstraintType *)local_1d0);
      }
      else {
        *__position._M_current = ConstraintTypeCustom;
        *(ConstraintType **)(this + 0x10) = __position._M_current + 1;
      }
      uVar6 = (int)local_238 + (int)uVar9;
      local_240->m_data[uVar6] = 0.0;
      local_248->m_data[uVar6] = 0.0;
      local_250->m_data[uVar6] = 0.0;
      ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x140))->m_data[uVar6] = 0.0;
      ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x150))->m_data[uVar6] = 0.0;
      uVar9 = uVar9 + 1;
    } while (uVar9 < ((local_280->
                      super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr)->sizeOfConstraint);
  }
  if ((char *)local_278._M_string_length != (char *)0x0) {
    lVar2 = *(long *)(this + 0xd0);
    lVar3 = *(long *)(this + 200);
    lVar4 = *(long *)(*(long *)(this + 0x28) + -0x20);
    local_1d0._0_8_ = (long)local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d0,lVar4,*(long *)(*(long *)(this + 0x28) + -0x18) + lVar4);
    local_1b0 = (int)((ulong)(lVar2 - lVar3) >> 4) - 1;
    pVar10 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
             ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                         *)(this + 0x38),
                        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)local_1d0);
    if (local_1d0._0_8_ != (long)local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,(ulong)(local_1c0._M_allocated_capacity + 1));
    }
    if (pVar10.second == false) {
      pRVar7 = (RBDLError *)__cxa_allocate_exception(0x28);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,"Error: optional name is not unique.\n","");
      Errors::RBDLError::RBDLError(pRVar7,&local_210);
      __cxa_throw(pRVar7,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
  }
  local_1d0._0_4_ =
       ((local_280->super___shared_ptr<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->id;
  if (local_1d0._0_4_ != 0xffffffff) {
    local_1d0._4_4_ = (int)((ulong)(*(long *)(this + 0xd0) - *(long *)(this + 200)) >> 4) - 1;
    pVar11 = std::
             _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
             ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
                       ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                         *)(this + 0x68),(pair<unsigned_int,_unsigned_int> *)local_1d0);
    if (pVar11.second == false) {
      pRVar7 = (RBDLError *)__cxa_allocate_exception(0x28);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"Error: optional userDefinedId is not unique.\n","");
      Errors::RBDLError::RBDLError(pRVar7,&local_230);
      __cxa_throw(pRVar7,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
  }
  uVar6 = local_284 - 1;
  local_1d0._4_4_ = (int)((ulong)(*(long *)(this + 0xd0) - *(long *)(this + 200)) >> 4) - 1;
  local_1d0._0_4_ = uVar6;
  pVar11 = std::
           _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
           ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
                     ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                       *)(this + 0x98),(pair<unsigned_int,_unsigned_int> *)local_1d0);
  if (pVar11.second != false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    return uVar6;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d0);
  poVar1 = (ostream *)(local_1d0 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Error: Constraint row entry into system is not unique.",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," (This should not be possible: contact the maintainer of this code.)",0x44);
  std::endl<char,std::char_traits<char>>(poVar1);
  pRVar7 = (RBDLError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  Errors::RBDLError::RBDLError(pRVar7,&local_1f0);
  __cxa_throw(pRVar7,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int ConstraintSet::AddCustomConstraint(
  std::shared_ptr<Constraint> customConstraint)
{
  unsigned int insertAtRowInG = unsigned(size());
  unsigned int rowsInG = insertAtRowInG+customConstraint->getConstraintSize();
  unsigned int cIndex = constraints.size();

  constraints.emplace_back(customConstraint);
  constraints[cIndex]->addToConstraintSet(insertAtRowInG);

  //Resize constraint set system variables
  std::string nameStr("");
  if(customConstraint->getName() != NULL) {
    nameStr = customConstraint->getName();
  }

  err.conservativeResize(     rowsInG);
  errd.conservativeResize(    rowsInG);
  force.conservativeResize (  rowsInG);
  impulse.conservativeResize (rowsInG);
  v_plus.conservativeResize ( rowsInG);
  d_multdof3_u = std::vector<Math::Vector3d>(rowsInG, Math::Vector3d::Zero());

  for(unsigned int i=0; i<customConstraint->getConstraintSize(); ++i) {
    //The list of names, constraint types, and ids must have the same
    //number of entries as G has rows.
    name.push_back (nameStr);
    constraintType.push_back (ConstraintTypeCustom);


    err[      insertAtRowInG+i ] = 0.;
    errd[     insertAtRowInG+i ] = 0.;
    force[    insertAtRowInG+i ] = 0.;
    impulse[  insertAtRowInG+i ] = 0.;
    v_plus[   insertAtRowInG+i ] = 0.;
  }

  //Set up access maps
  if(nameStr.size() > 0) {
    std::pair< std::map<std::string, unsigned int>::iterator, bool > iter;
    iter = nameGroupMap.insert(std::pair<std::string, unsigned int>(
                                 name[name.size()-1],
                                 unsigned(constraints.size()-1)));
    if(iter.second == false) {
      throw Errors::RBDLError("Error: optional name is not unique.\n");
    }

  }
  if(customConstraint->getUserDefinedId()
      < std::numeric_limits<unsigned int>::max()) {
    std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
    iter =userDefinedIdGroupMap.insert( std::pair<unsigned int, unsigned int>(
                                          customConstraint->getUserDefinedId(),
                                          unsigned(constraints.size()-1)));
    if(iter.second == false) {
      throw Errors::RBDLError("Error: optional userDefinedId is not unique.\n");
    }

  }

  std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
  iter = idGroupMap.insert(std::pair<unsigned int, unsigned int>(
                             unsigned(rowsInG-1),
                             unsigned(constraints.size()-1)));
  if(iter.second == false) {
    std::stringstream errormsg;
    errormsg << "Error: Constraint row entry into system is not unique."
             << " (This should not be possible: contact the "
             "maintainer of this code.)"
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  return rowsInG-1;

}